

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O0

void __thiscall
afsm::
state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
::process_deferred_queue
          (state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
           *this)

{
  __atomic_flag_data_type _Var1;
  id_type *piVar2;
  bool bVar3;
  bool bVar4;
  size_type sVar5;
  size_type sVar6;
  pointer ppVar7;
  size_t in_R9;
  pair<std::_Rb_tree_const_iterator<const_afsm::detail::event_base::id_type_*>,_bool> pVar8;
  uint in_stack_fffffffffffffdb8;
  _List_const_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
  local_158;
  _List_const_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
  local_150;
  iterator local_148;
  _List_const_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
  local_140;
  _Self local_138;
  _Self local_130;
  iterator next_1;
  size_t count_1;
  _Self local_118;
  iterator event_1;
  iterator local_108;
  const_iterator local_100;
  _Base_ptr local_f8;
  undefined1 local_f0;
  _List_const_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
  local_e8;
  _List_const_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
  local_e0;
  iterator local_d8;
  _List_const_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
  local_d0;
  _Self local_c8;
  _Self local_c0;
  iterator next;
  size_t count;
  iterator local_a8;
  const_iterator local_a0;
  _Self local_98;
  _Self local_90;
  iterator event;
  event_process_result res;
  undefined1 local_78 [8];
  event_set event_ids;
  deferred_queue deferred;
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  *this_local;
  memory_order __b;
  
  LOCK();
  _Var1 = (this->deferred_top_).super___atomic_flag_base._M_i;
  (this->deferred_top_).super___atomic_flag_base._M_i = true;
  UNLOCK();
  if (_Var1 == false) {
    std::__cxx11::
    list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
    ::list((list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
            *)&event_ids._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
    ::set((set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
           *)local_78);
    bVar3 = skip_deferred_queue(this);
    if (bVar3) {
      detail::observer_wrapper<afsm::test::test_fsm_observer>::
      skip_processing_deferred_queue<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
                (&this->super_observer_wrapper<afsm::test::test_fsm_observer>,this);
    }
    else {
      std::
      swap<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
                (&this->deferred_events_,
                 (list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                  *)&event_ids._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      swap<afsm::detail::event_base::id_type_const*,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
                (&this->deferred_event_ids_,
                 (set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
                  *)local_78);
    }
    while (bVar3 = std::__cxx11::
                   list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                   ::empty((list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                            *)&event_ids._M_t._M_impl.super__Rb_tree_header._M_node_count),
          ((bVar3 ^ 0xffU) & 1) != 0) {
      sVar5 = std::__cxx11::
              list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
              ::size((list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                      *)&event_ids._M_t._M_impl.super__Rb_tree_header._M_node_count);
      detail::observer_wrapper<afsm::test::test_fsm_observer>::
      start_process_deferred_queue<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
                (&this->super_observer_wrapper<afsm::test::test_fsm_observer>,this,sVar5);
      event._M_node._0_4_ = refuse;
      local_90._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
           ::begin((list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                    *)&event_ids._M_t._M_impl.super__Rb_tree_header._M_node_count);
      do {
        local_98._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
             ::end((list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                    *)&event_ids._M_t._M_impl.super__Rb_tree_header._M_node_count);
        bVar3 = std::operator!=(&local_90,&local_98);
        if (!bVar3) break;
        ppVar7 = std::
                 _List_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
                 ::operator->(&local_90);
        sVar6 = std::
                set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
                ::count(&this->handled_,&ppVar7->second);
        if (sVar6 == 0) {
          ppVar7 = std::
                   _List_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
                   ::operator->(&local_90);
          sVar6 = std::
                  set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
                  ::count(&this->deferred_,&ppVar7->second);
          if (sVar6 == 0) {
            local_108._M_node =
                 (_List_node_base *)
                 std::
                 _List_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
                 ::operator++(&local_90,0);
            std::
            _List_const_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
            ::_List_const_iterator(&local_100,&local_108);
            event_1 = std::__cxx11::
                      list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                      ::erase((list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                               *)&event_ids._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              local_100);
            detail::observer_wrapper<afsm::test::test_fsm_observer>::
            drop_deferred_event<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
                      (&this->super_observer_wrapper<afsm::test::test_fsm_observer>,this);
          }
          else {
            next._M_node = (_List_node_base *)0x0;
            local_c0._M_node = local_90._M_node;
            while( true ) {
              local_c8._M_node =
                   (_List_node_base *)
                   std::__cxx11::
                   list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                   ::end((list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                          *)&event_ids._M_t._M_impl.super__Rb_tree_header._M_node_count);
              bVar4 = std::operator!=(&local_c0,&local_c8);
              bVar3 = false;
              if (bVar4) {
                ppVar7 = std::
                         _List_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
                         ::operator->(&local_c0);
                piVar2 = ppVar7->second;
                ppVar7 = std::
                         _List_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
                         ::operator->(&local_90);
                bVar3 = piVar2 == ppVar7->second;
              }
              if (!bVar3) break;
              std::
              _List_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
              ::operator++(&local_c0);
              next._M_node = (_List_node_base *)((long)&(next._M_node)->_M_next + 1);
            }
            local_d8._M_node =
                 (_List_node_base *)
                 std::__cxx11::
                 list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                 ::end(&this->deferred_events_);
            std::
            _List_const_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
            ::_List_const_iterator(&local_d0,&local_d8);
            std::
            _List_const_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
            ::_List_const_iterator(&local_e0,&local_90);
            std::
            _List_const_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
            ::_List_const_iterator(&local_e8,&local_c0);
            std::__cxx11::
            list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
            ::splice(&this->deferred_events_,(int)local_d0._M_node,
                     (__off64_t *)&event_ids._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (int)local_e0._M_node,(__off64_t *)local_e8._M_node,in_R9,
                     in_stack_fffffffffffffdb8);
            ppVar7 = std::
                     _List_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
                     ::operator->(&local_90);
            pVar8 = std::
                    set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
                    ::insert(&this->deferred_event_ids_,&ppVar7->second);
            local_f8 = (_Base_ptr)pVar8.first._M_node;
            local_f0 = pVar8.second;
            local_90._M_node = local_c0._M_node;
            detail::observer_wrapper<afsm::test::test_fsm_observer>::
            postpone_deferred_events<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
                      (&this->super_observer_wrapper<afsm::test::test_fsm_observer>,this,
                       (size_t)next._M_node);
          }
        }
        else {
          ppVar7 = std::
                   _List_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
                   ::operator->(&local_90);
          event._M_node._0_4_ =
               std::function<afsm::actions::event_process_result_()>::operator()(&ppVar7->first);
          local_a8._M_node =
               (_List_node_base *)
               std::
               _List_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
               ::operator++(&local_90,0);
          std::
          _List_const_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
          ::_List_const_iterator(&local_a0,&local_a8);
          std::__cxx11::
          list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
          ::erase((list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                   *)&event_ids._M_t._M_impl.super__Rb_tree_header._M_node_count,local_a0);
        }
      } while ((event_process_result)event._M_node != process);
      local_118._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
           ::begin((list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                    *)&event_ids._M_t._M_impl.super__Rb_tree_header._M_node_count);
      while( true ) {
        count_1 = (size_t)std::__cxx11::
                          list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                          ::end((list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                                 *)&event_ids._M_t._M_impl.super__Rb_tree_header._M_node_count);
        bVar3 = std::operator!=(&local_118,(_Self *)&count_1);
        if (!bVar3) break;
        next_1._M_node = (_List_node_base *)0x0;
        local_130._M_node = local_118._M_node;
        while( true ) {
          local_138._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
               ::end((list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                      *)&event_ids._M_t._M_impl.super__Rb_tree_header._M_node_count);
          bVar4 = std::operator!=(&local_130,&local_138);
          bVar3 = false;
          if (bVar4) {
            ppVar7 = std::
                     _List_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
                     ::operator->(&local_130);
            piVar2 = ppVar7->second;
            ppVar7 = std::
                     _List_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
                     ::operator->(&local_118);
            bVar3 = piVar2 == ppVar7->second;
          }
          if (!bVar3) break;
          next_1._M_node = (_List_node_base *)((long)&(next_1._M_node)->_M_next + 1);
          std::
          _List_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
          ::operator++(&local_130);
        }
        local_148._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
             ::end(&this->deferred_events_);
        std::
        _List_const_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
        ::_List_const_iterator(&local_140,&local_148);
        std::
        _List_const_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
        ::_List_const_iterator(&local_150,&local_118);
        std::
        _List_const_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
        ::_List_const_iterator(&local_158,&local_130);
        std::__cxx11::
        list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
        ::splice(&this->deferred_events_,(int)local_140._M_node,
                 (__off64_t *)&event_ids._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (int)local_150._M_node,(__off64_t *)local_158._M_node,in_R9,
                 in_stack_fffffffffffffdb8);
        ppVar7 = std::
                 _List_iterator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>
                 ::operator->(&local_118);
        std::
        set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
        ::insert(&this->deferred_event_ids_,&ppVar7->second);
        local_118._M_node = local_130._M_node;
        detail::observer_wrapper<afsm::test::test_fsm_observer>::
        postpone_deferred_events<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
                  (&this->super_observer_wrapper<afsm::test::test_fsm_observer>,this,
                   (size_t)next_1._M_node);
      }
      std::
      set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
      ::clear((set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
               *)local_78);
      sVar5 = std::__cxx11::
              list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
              ::size(&this->deferred_events_);
      detail::observer_wrapper<afsm::test::test_fsm_observer>::
      end_process_deferred_queue<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
                (&this->super_observer_wrapper<afsm::test::test_fsm_observer>,this,sVar5);
      if ((event_process_result)event._M_node == process) {
        bVar3 = skip_deferred_queue(this);
        if (bVar3) {
          detail::observer_wrapper<afsm::test::test_fsm_observer>::
          skip_processing_deferred_queue<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
                    (&this->super_observer_wrapper<afsm::test::test_fsm_observer>,this);
        }
        else {
          std::
          swap<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
                    (&this->deferred_events_,
                     (list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                      *)&event_ids._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::
          swap<afsm::detail::event_base::id_type_const*,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
                    (&this->deferred_event_ids_,
                     (set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
                      *)local_78);
        }
      }
    }
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    LOCK();
    (this->deferred_top_).super___atomic_flag_base._M_i = false;
    UNLOCK();
    std::
    set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
    ::~set((set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
            *)local_78);
    std::__cxx11::
    list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
    ::~list((list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
             *)&event_ids._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return;
}

Assistant:

void
    process_deferred_queue()
    {
        if (!deferred_top_.test_and_set()) {
            using actions::event_process_result;
            deferred_queue deferred;
            detail::event_set event_ids;
            if (skip_deferred_queue()) {
                observer_wrapper::skip_processing_deferred_queue(*this);
            } else {
                ::std::swap(deferred_events_, deferred);
                ::std::swap(deferred_event_ids_, event_ids);
            }
            while (!deferred.empty()) {
                observer_wrapper::start_process_deferred_queue(*this, deferred.size());
                auto res = event_process_result::refuse;
                for (auto event = deferred.begin(); event != deferred.end();) {
                    if (handled_.count(event->second)) {
                        res = event->first();
                        deferred.erase(event++);
                    } else if (deferred_.count(event->second)) {
                        // Move directly to the deferred queue
                        ::std::size_t count{0};
                        auto next = event;
                        while (next != deferred.end() && next->second == event->second) {
                            ++next;
                            ++count;
                        }
                        deferred_events_.splice(deferred_events_.end(),
                            deferred, event, next);
                        deferred_event_ids_.insert(event->second);
                        event = next;
                        observer_wrapper::postpone_deferred_events(*this, count);
                    } else {
                        deferred.erase(event++);
                        observer_wrapper::drop_deferred_event(*this);
                    }
                    if (res == event_process_result::process)
                        break;
                }
                for (auto event = deferred.begin(); event != deferred.end();) {
                    ::std::size_t count{0};
                    auto next = event;
                    while (next != deferred.end() && next->second == event->second) {
                        ++count;
                        ++next;
                    }
                    deferred_events_.splice(deferred_events_.end(),
                        deferred, event, next);
                    deferred_event_ids_.insert(event->second);
                    event = next;
                    observer_wrapper::postpone_deferred_events(*this, count);
                }
                event_ids.clear();
                observer_wrapper::end_process_deferred_queue(*this, deferred_events_.size());
                if (res == event_process_result::process) {
                    if (skip_deferred_queue()) {
                        observer_wrapper::skip_processing_deferred_queue(*this);
                    } else {
                        ::std::swap(deferred_events_, deferred);
                        ::std::swap(deferred_event_ids_, event_ids);
                    }
                }
            }
            deferred_top_.clear();
        }
    }